

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

bool __thiscall internalJSONNode::IsEqualTo(internalJSONNode *this,internalJSONNode *val)

{
  uchar uVar1;
  uchar uVar2;
  bool bVar3;
  json_index_t jVar4;
  json_index_t jVar5;
  JSONNode **ppJVar6;
  JSONNode **myrunner_end;
  JSONNode **myrunner;
  JSONNode **valrunner;
  internalJSONNode *val_local;
  internalJSONNode *this_local;
  
  if (this == val) {
    this_local._7_1_ = true;
  }
  else {
    uVar1 = type(this);
    uVar2 = type(val);
    if (uVar1 == uVar2) {
      bVar3 = std::operator!=(&this->_name,&val->_name);
      if (bVar3) {
        this_local._7_1_ = false;
      }
      else {
        uVar1 = type(this);
        if (uVar1 == '\0') {
          this_local._7_1_ = true;
        }
        else {
          Fetch(this);
          Fetch(val);
          uVar1 = type(this);
          if (uVar1 == '\x01') {
            this_local._7_1_ = std::operator==(&val->_string,&this->_string);
          }
          else if (uVar1 == '\x02') {
            this_local._7_1_ = _floatsAreEqual(&(val->_value)._number,&(this->_value)._number);
          }
          else if (uVar1 == '\x03') {
            this_local._7_1_ = ((val->_value)._bool & 1U) == ((this->_value)._bool & 1U);
          }
          else {
            jVar4 = jsonChildren::size(this->Children);
            jVar5 = jsonChildren::size(val->Children);
            if (jVar4 == jVar5) {
              myrunner = jsonChildren::begin(val->Children);
              myrunner_end = jsonChildren::begin(this->Children);
              ppJVar6 = jsonChildren::end(this->Children);
              for (; myrunner_end != ppJVar6; myrunner_end = myrunner_end + 1) {
                bVar3 = ::JSONNode::operator!=(*myrunner_end,*myrunner);
                if (bVar3) {
                  return false;
                }
                myrunner = myrunner + 1;
              }
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool internalJSONNode::IsEqualTo(const internalJSONNode * val) const json_nothrow {
    if (this == val) return true;  //same internal object, so they must be equal (not only for ref counting)
    if (type() != val -> type()) return false;	 //aren't even same type
    if (_name != val -> _name) return false;  //names aren't the same
    if (type() == JSON_NULL) return true;  //both null, can't be different
    #if !defined(JSON_PREPARSE) && defined(JSON_READ_PRIORITY) 
	   Fetch();
	   val -> Fetch();
    #endif 
    switch (type()){
	   case JSON_STRING:
		  return val -> _string == _string;
	   case JSON_NUMBER:
		  return _floatsAreEqual(val -> _value._number, _value._number);
	   case JSON_BOOL:
		  return val -> _value._bool == _value._bool;
    };

    JSON_ASSERT(type() == JSON_NODE || type() == JSON_ARRAY, JSON_TEXT("Checking for equality, not sure what type"));
    if (CHILDREN -> size() != val -> CHILDREN -> size()) return false;  //if they arne't he same size then they certainly aren't equal

    //make sure each children is the same
    JSONNode ** valrunner = val -> CHILDREN -> begin();
    json_foreach(CHILDREN, myrunner){
        JSON_ASSERT(*myrunner != NULL, json_global(ERROR_NULL_IN_CHILDREN));
		JSON_ASSERT(*valrunner != NULL, json_global(ERROR_NULL_IN_CHILDREN));
		JSON_ASSERT(valrunner != val -> CHILDREN -> end(), JSON_TEXT("at the end of other one's children, but they're the same size?"));
        if (**myrunner != **valrunner) return false;
		++valrunner;
    }
    return true;
}